

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.h
# Opt level: O0

void llvm::yaml::ScalarEnumerationTraits<llvm::dwarf::Form,_void>::enumeration(IO *io,Form *value)

{
  Form *value_local;
  IO *io_local;
  
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_addr",DW_FORM_addr);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_block2",DW_FORM_block2);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_block4",DW_FORM_block4);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_data2",DW_FORM_data2);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_data4",DW_FORM_data4);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_data8",DW_FORM_data8);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_string",DW_FORM_string);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_block",DW_FORM_block);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_block1",DW_FORM_block1);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_data1",DW_FORM_data1);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_flag",DW_FORM_flag);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_sdata",DW_FORM_sdata);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_strp",DW_FORM_strp);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_udata",DW_FORM_udata);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_ref_addr",DW_FORM_ref_addr);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_ref1",DW_FORM_ref1);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_ref2",DW_FORM_ref2);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_ref4",DW_FORM_ref4);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_ref8",DW_FORM_ref8);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_ref_udata",DW_FORM_ref_udata);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_indirect",DW_FORM_indirect);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_sec_offset",DW_FORM_sec_offset);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_exprloc",DW_FORM_exprloc);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_flag_present",DW_FORM_flag_present);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_ref_sig8",DW_FORM_ref_sig8);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_strx",DW_FORM_strx);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_addrx",DW_FORM_addrx);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_ref_sup4",DW_FORM_ref_sup4);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_strp_sup",DW_FORM_strp_sup);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_data16",DW_FORM_data16);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_line_strp",DW_FORM_line_strp);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_implicit_const",DW_FORM_implicit_const);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_loclistx",DW_FORM_loclistx);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_rnglistx",DW_FORM_rnglistx);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_ref_sup8",DW_FORM_ref_sup8);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_strx1",DW_FORM_strx1);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_strx2",DW_FORM_strx2);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_strx3",DW_FORM_strx3);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_strx4",DW_FORM_strx4);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_addrx1",DW_FORM_addrx1);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_addrx2",DW_FORM_addrx2);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_addrx3",DW_FORM_addrx3);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_addrx4",DW_FORM_addrx4);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_GNU_addr_index",DW_FORM_GNU_addr_index);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_GNU_str_index",DW_FORM_GNU_str_index);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_GNU_ref_alt",DW_FORM_GNU_ref_alt);
  IO::enumCase<llvm::dwarf::Form>(io,value,"DW_FORM_GNU_strp_alt",DW_FORM_GNU_strp_alt);
  IO::enumFallback<llvm::yaml::Hex16,llvm::dwarf::Form>(io,value);
  return;
}

Assistant:

static void enumeration(IO &io, dwarf::Form &value) {
#include "llvm/BinaryFormat/Dwarf.def"
    io.enumFallback<Hex16>(value);
  }